

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O1

size_t tt::detail::convert<unsigned_long>(char *buf,unsigned_long value)

{
  char cVar1;
  unsigned_long uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  uVar2 = value;
  pcVar4 = buf;
  do {
    pcVar5 = pcVar4;
    *pcVar5 = *(char *)(zero + uVar2 % 10);
    pcVar4 = pcVar5 + 1;
    bVar6 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar6);
  if (value != 0) {
    *pcVar4 = '-';
    pcVar4 = pcVar5 + 2;
  }
  *pcVar4 = '\0';
  pcVar5 = pcVar4 + -1;
  if (buf < pcVar5 && (long)pcVar4 - (long)buf != 0) {
    pcVar3 = buf + 1;
    do {
      cVar1 = pcVar3[-1];
      pcVar3[-1] = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      bVar6 = pcVar3 < pcVar5;
      pcVar3 = pcVar3 + 1;
    } while (bVar6);
  }
  return (long)pcVar4 - (long)buf;
}

Assistant:

size_t convert(char buf[],T value){ //将数值转换为字符串
	T i = value;
	char* p = buf;

	do{
		int lsd = static_cast<int>(i % 10);
		i /= 10;
		*p++ = zero[lsd];
		
	}while(i != 0);

	if(value << 0){
		*p++ = '-';
	}

	*p = '\0';

	std::reverse(buf,p);

	return p - buf;
}